

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

bool testing::internal::anon_unknown_37::ContainsUnprintableControlCodes(char *str,size_t length)

{
  byte bVar1;
  int iVar2;
  ulong uStack_30;
  uchar ch;
  size_t i;
  uchar *s;
  size_t length_local;
  char *str_local;
  
  uStack_30 = 0;
  i = (size_t)str;
  while( true ) {
    if (length <= uStack_30) {
      return false;
    }
    bVar1 = *(byte *)i;
    iVar2 = iscntrl((uint)bVar1);
    if (((iVar2 != 0) && (1 < bVar1 - 9)) && (bVar1 != 0xd)) break;
    uStack_30 = uStack_30 + 1;
    i = i + 1;
  }
  return true;
}

Assistant:

bool ContainsUnprintableControlCodes(const char* str, size_t length) {
  const unsigned char* s = reinterpret_cast<const unsigned char*>(str);

  for (size_t i = 0; i < length; i++) {
    unsigned char ch = *s++;
    if (std::iscntrl(ch)) {
      switch (ch) {
        case '\t':
        case '\n':
        case '\r':
          break;
        default:
          return true;
      }
    }
  }
  return false;
}